

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O2

int ffupck(fitsfile *fptr,int *status)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  LONGLONG headstart;
  unsigned_long sum;
  LONGLONG datastart;
  double local_1a8;
  LONGLONG dataend;
  char datestr [20];
  char checksum [71];
  char chkcomm [73];
  char datasum [71];
  char comm [73];
  
  if (0 < *status) {
    return *status;
  }
  ffgstm(datestr,(int *)0x0,status);
  builtin_strncpy(chkcomm + 0x10,"ated ",6);
  builtin_strncpy(chkcomm,"HDU checksum upd",0x10);
  strcat(chkcomm,datestr);
  iVar1 = ffgkys(fptr,"DATASUM",datasum,comm,status);
  if (iVar1 == 0xca) {
    ffpmsg("DATASUM keyword not found (ffupck");
    goto LAB_0011a3f9;
  }
  local_1a8 = atof(datasum);
  iVar2 = ffghadll(fptr,&headstart,&datastart,&dataend,status);
  iVar1 = *status;
  if (0 < iVar2) {
    return iVar1;
  }
  uVar3 = (long)(local_1a8 - 9.223372036854776e+18) & (long)local_1a8 >> 0x3f | (long)local_1a8;
  iVar2 = ffgkys(fptr,"CHECKSUM",checksum,comm,status);
  if (iVar2 == 0xca) {
    *status = iVar1;
    builtin_strncpy(checksum,"0000000000000000",0x11);
    ffpkys(fptr,"CHECKSUM",checksum,chkcomm,status);
  }
  else {
    iVar1 = ffwend(fptr,status);
    if (0 < iVar1) goto LAB_0011a3f9;
    ffmbyt(fptr,headstart,0,status);
    sum = uVar3;
    iVar1 = ffcsum(fptr,(datastart - headstart) / 0xb40,&sum,status);
    if (((0 < iVar1) || (sum == 0)) || (sum == 0xffffffff)) goto LAB_0011a3f9;
    ffmkys(fptr,"CHECKSUM","0000000000000000",chkcomm,status);
  }
  ffmbyt(fptr,headstart,0,status);
  sum = uVar3;
  iVar1 = ffcsum(fptr,(datastart - headstart) / 0xb40,&sum,status);
  if (iVar1 < 1) {
    ffesum(sum,1,checksum);
    ffmkys(fptr,"CHECKSUM",checksum,"&",status);
  }
LAB_0011a3f9:
  return *status;
}

Assistant:

int ffupck(fitsfile *fptr,      /* I - FITS file pointer                  */
           int *status)         /* IO - error status                      */
/*
   Update the CHECKSUM keyword value.  This assumes that the DATASUM
   keyword exists and has the correct value.
*/
{
    char datestr[20], chkcomm[FLEN_COMMENT], comm[FLEN_COMMENT];
    char checksum[FLEN_VALUE], datasum[FLEN_VALUE];
    int tstatus;
    long nrec;
    LONGLONG headstart, datastart, dataend;
    unsigned long sum, dsum;
    double tdouble;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* generate current date string and construct the keyword comments */
    ffgstm(datestr, NULL, status);
    strcpy(chkcomm, "HDU checksum updated ");
    strcat(chkcomm, datestr);

    /* get the DATASUM keyword and convert it to a unsigned long */
    if (ffgkys(fptr, "DATASUM", datasum, comm, status) == KEY_NO_EXIST)
    {
        ffpmsg("DATASUM keyword not found (ffupck");
        return(*status);
    }

    tdouble = atof(datasum); /* read as a double as a workaround */
    dsum = (unsigned long) tdouble;

    /* get size of the HDU */
    if (ffghadll(fptr, &headstart, &datastart, &dataend, status) > 0)
        return(*status);

    /* get the checksum keyword, if it exists */
    tstatus = *status;
    if (ffgkys(fptr, "CHECKSUM", checksum, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        strcpy(checksum, "0000000000000000");
        ffpkys(fptr, "CHECKSUM", checksum, chkcomm, status);
    }
    else
    {
        /* check if CHECKSUM is still OK */
        /* rewrite END keyword and following blank fill */
        if (ffwend(fptr, status) > 0)
            return(*status);

        /* move to the start of the header */
        ffmbyt(fptr, headstart, REPORT_EOF, status);

        /* accumulate the header checksum into the previous data checksum */
        nrec = (long) ((datastart - headstart) / 2880);
        sum = dsum;
        if (ffcsum(fptr, nrec, &sum, status) > 0)
           return(*status);

        if (sum == 0 || sum == 0xFFFFFFFF)
           return(*status);    /* CHECKSUM is already correct */

        /* Zero the CHECKSUM and recompute the new value */
        ffmkys(fptr, "CHECKSUM", "0000000000000000", chkcomm, status);
    }

    /* move to the start of the header */
    ffmbyt(fptr, headstart, REPORT_EOF, status);

    /* accumulate the header checksum into the previous data checksum */
    nrec = (long) ((datastart - headstart) / 2880);
    sum = dsum;
    if (ffcsum(fptr, nrec, &sum, status) > 0)
           return(*status);

    /* encode the COMPLEMENT of the checksum into a 16-character string */
    ffesum(sum, TRUE, checksum);

    /* update the CHECKSUM keyword value with the new string */
    ffmkys(fptr, "CHECKSUM", checksum, "&", status);

    return(*status);
}